

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

void mbedtls_ssl_send_flight_completed(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_context *ssl_local;
  
  ssl_reset_retransmit_timeout(ssl);
  ssl_set_timer(ssl,ssl->handshake->retransmit_timeout);
  if ((ssl->in_msgtype == 0x16) && (*ssl->in_msg == '\x14')) {
    ssl->handshake->retransmit_state = '\x03';
  }
  else {
    ssl->handshake->retransmit_state = '\x02';
  }
  return;
}

Assistant:

void mbedtls_ssl_send_flight_completed( mbedtls_ssl_context *ssl )
{
    ssl_reset_retransmit_timeout( ssl );
    ssl_set_timer( ssl, ssl->handshake->retransmit_timeout );

    if( ssl->in_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE &&
        ssl->in_msg[0] == MBEDTLS_SSL_HS_FINISHED )
    {
        ssl->handshake->retransmit_state = MBEDTLS_SSL_RETRANS_FINISHED;
    }
    else
        ssl->handshake->retransmit_state = MBEDTLS_SSL_RETRANS_WAITING;
}